

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

size_t __thiscall
AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize
          (AccountingTestMemoryAllocator *this,char *memory)

{
  size_t sVar1;
  AccountingTestMemoryAllocatorMemoryNode *in_RSI;
  AccountingTestMemoryAllocator *in_RDI;
  AccountingTestMemoryAllocatorMemoryNode *node;
  AccountingTestMemoryAllocator *in_stack_ffffffffffffffe0;
  AccountingTestMemoryAllocatorMemoryNode *pAVar2;
  size_t local_8;
  
  if ((in_RDI->head_ == (AccountingTestMemoryAllocatorMemoryNode *)0x0) ||
     ((AccountingTestMemoryAllocatorMemoryNode *)in_RDI->head_->memory_ != in_RSI)) {
    for (pAVar2 = in_RDI->head_; pAVar2 != (AccountingTestMemoryAllocatorMemoryNode *)0x0;
        pAVar2 = pAVar2->next_) {
      if ((pAVar2->next_ != (AccountingTestMemoryAllocatorMemoryNode *)0x0) &&
         ((AccountingTestMemoryAllocatorMemoryNode *)pAVar2->next_->memory_ == in_RSI)) {
        sVar1 = removeNextNodeAndReturnSize(in_RDI,in_RSI);
        return sVar1;
      }
    }
    local_8 = 0;
  }
  else {
    local_8 = removeHeadAndReturnSize(in_stack_ffffffffffffffe0);
  }
  return local_8;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize(char* memory)
{
    if (head_ && head_->memory_ == memory)
        return removeHeadAndReturnSize();

    for (AccountingTestMemoryAllocatorMemoryNode* node = head_; node; node = node->next_) {
        if (node->next_ && node->next_->memory_ == memory)
            return removeNextNodeAndReturnSize(node);
    }

    return 0;
}